

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O0

void __thiscall PrimeExtractor::PrimeExtractor(PrimeExtractor *this,long stop)

{
  ulong uVar1;
  size_type sVar2;
  __type __x;
  double dVar3;
  reference rVar4;
  reference local_58;
  reference local_48;
  ulong local_38;
  long i;
  long local_20;
  long stop_limited;
  long stop_local;
  PrimeExtractor *this_local;
  
  stop_limited = stop;
  stop_local = (long)this;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->primeCand);
  local_20 = stop_limited / 2 + 1;
  this->stop = stop_limited;
  std::vector<bool,_std::allocator<bool>_>::resize(&this->primeCand,stop_limited / 2 + 2,false);
  __x = std::sqrt<long>(stop_limited);
  dVar3 = ceil(__x);
  this->stopSqrt = (long)dVar3;
  local_38 = 0;
  while( true ) {
    uVar1 = local_38;
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(&this->primeCand);
    if (sVar2 <= uVar1) break;
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->primeCand,local_38);
    local_48 = rVar4;
    std::_Bit_reference::operator=(&local_48,true);
    local_38 = local_38 + 1;
  }
  local_58 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->primeCand,1);
  std::_Bit_reference::operator=(&local_58,true);
  return;
}

Assistant:

PrimeExtractor::PrimeExtractor(long stop)
{
  /**
   * The internal data structure consists of a vector of booleans.
   * Given a stop count indicating running until reaching this stop. The binary
   * vector size is just half of the stop count - since half of the numbers are
   * even and therefore not prime. So this leads considerung the iterations to
   * the example tables below. Under the title iterateVector are
   * - index within the vector
   * - value of that index
   * natural stands for the number represended by this index.
   * 
   * Init:
   * iterateVector  natural
   *  0    false        1
   *  1    true         3
   *  2    true         5
   *  3    true         7
   *  4    true         9
   *  5    true        11 
   *  6    true        13
   *  7    true        15
   *  8    true        17
   *  9    true        19
   * 10    true        21
   * 11    true        23
   * 12    true        25
   *
   * First interation:
   * findNextStep returns 1 * 2 + 1 = 3
   * iterateVector  natural
   *  0    false        1
   *  1    true         3
   *  2    true         5
   *  3    true         7
   *  4    false        9
   *  5    true        11 
   *  6    true        13
   *  7    false       15
   *  8    true        17
   *  9    true        19
   * 10    false       21
   * 11    true        23
   * 12    true        25
   *
   * Second iteration:
   * findNextStep returns 2 * 2 +1 = 5
   * iterateVector  natural
   *  0    false        1
   *  1    true         3
   *  2    true         5
   *  3    true         7
   *  4    false        9
   *  5    true        11 
   *  6    true        13
   *  7    false       15
   *  8    true        17
   *  9    true        19
   * 10    false       21
   * 11    true        23
   * 12    false       25
   *
   **/
  long stop_limited = stop / 2 + 1;
  
  this->stop = stop ;
  this->primeCand.resize(stop_limited + 1);
  this->stopSqrt = (long)ceil(sqrt(stop));
  for(long i = 0; i < this->primeCand.size()  ; i++) {
    this->primeCand[i] = true;
  }
  this->primeCand[1] = true;
}